

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_json.cc
# Opt level: O2

void __thiscall
QPDF::JSONReactor::replaceObject(JSONReactor *this,QPDFObjectHandle *replacement,JSON *value)

{
  QPDF *this_00;
  bool bVar1;
  QPDFObjGen og;
  QPDFObjGen QVar2;
  qpdf_offset_t offset;
  QPDFObjectHandle *this_01;
  allocator<char> local_69;
  JSON *local_68;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_60;
  string local_50;
  
  this_01 = &(this->stack).
             super__Vector_base<QPDF::JSONReactor::StackFrame,_std::allocator<QPDF::JSONReactor::StackFrame>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].object;
  og = QPDFObjectHandle::getObjGen(this_01);
  bVar1 = QPDFObjectHandle::isIndirect(replacement);
  if (bVar1) {
    bVar1 = QPDFObjectHandle::isStream(replacement);
    if (bVar1) {
      QVar2 = QPDFObjectHandle::getObjGen(replacement);
      if (QVar2 == og) goto LAB_001cfd65;
    }
    offset = QPDFObjectHandle::getParsedOffset(replacement);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"the value of an object may not be an indirect object reference",
               &local_69);
    error(this,offset,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
LAB_001cfd65:
    this_00 = this->pdf;
    local_68 = value;
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_60,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)replacement);
    QPDF::replaceObject(this_00,og,(QPDFObjectHandle *)&local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
    getObject((QPDF *)&local_50,(QPDFObjGen)this->pdf);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&this->next_obj,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_50._M_string_length);
    setObjectDescription(this,this_01,local_68);
  }
  return;
}

Assistant:

void
QPDF::JSONReactor::replaceObject(QPDFObjectHandle&& replacement, JSON const& value)
{
    auto& tos = stack.back();
    auto og = tos.object.getObjGen();
    if (replacement.isIndirect() && !(replacement.isStream() && replacement.getObjGen() == og)) {
        error(
            replacement.getParsedOffset(),
            "the value of an object may not be an indirect object reference");
        return;
    }
    pdf.replaceObject(og, replacement);
    next_obj = pdf.getObject(og);
    setObjectDescription(tos.object, value);
}